

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::tfdt::print(tfdt *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *this_00;
  tfdt *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================tfdt==================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," basemediadecodetime: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,this->base_media_decode_time_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void tfdt::print() const {
		std::cout << "=================tfdt==================" << std::endl;
		std::cout << std::setw(33) << std::left << " basemediadecodetime: " << base_media_decode_time_ << std::endl;
	}